

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_sign.c
# Opt level: O2

size_t bignSign_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar1 = beltHash_keep();
  sVar2 = ecMulA_deep(n,ec_d,ec_deep,n);
  sVar3 = zzMul_deep(n >> 1,n);
  sVar4 = zzMod_deep(n + (n >> 1) + 1,n);
  sVar1 = utilMax(4,sVar1,sVar2,sVar3,sVar4);
  return sVar1 + n * 0x20;
}

Assistant:

static size_t bignSign_deep(size_t n, size_t f_deep, size_t ec_d,
	size_t ec_deep)
{
	return O_OF_W(4 * n) +
		utilMax(4,
			beltHash_keep(),
			ecMulA_deep(n, ec_d, ec_deep, n),
			zzMul_deep(n / 2, n),
			zzMod_deep(n + n / 2 + 1, n));
}